

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_visible,ImGuiTreeNodeFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImVec2 local_94;
  ImGuiID local_8c;
  float local_88;
  ImGuiID close_button_id;
  float button_y;
  float button_x;
  float button_size;
  ImGuiLastItemData last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiTreeNodeFlags flags_local;
  bool *p_visible_local;
  char *label_local;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    if ((p_visible == (bool *)0x0) || ((*p_visible & 1U) != 0)) {
      IVar2 = ImGuiWindow::GetID(this,label,(char *)0x0);
      window._4_4_ = flags | 0x1a;
      if (p_visible != (bool *)0x0) {
        window._4_4_ = flags | 0x10001e;
      }
      label_local._7_1_ = TreeNodeBehavior(IVar2,window._4_4_,label,(char *)0x0);
      if (p_visible != (bool *)0x0) {
        last_item_backup.DisplayRect.Max = (ImVec2)GImGui;
        memcpy(&button_x,&GImGui->LastItemData,0x3c);
        button_y = *(float *)((long)last_item_backup.DisplayRect.Max + 0x3d50);
        close_button_id =
             (ImGuiID)ImMax<float>(*(float *)((long)last_item_backup.DisplayRect.Max + 0x40bc),
                                   (-*(float *)((long)last_item_backup.DisplayRect.Max + 0x3944) +
                                    -*(float *)((long)last_item_backup.DisplayRect.Max + 0x3944) +
                                   *(float *)((long)last_item_backup.DisplayRect.Max + 0x40c4)) -
                                   button_y);
        local_88 = *(float *)((long)last_item_backup.DisplayRect.Max + 0x40c0);
        IVar2 = GetIDWithSeed("#CLOSE",(char *)0x0,IVar2);
        local_8c = IVar2;
        ImVec2::ImVec2(&local_94,(float)close_button_id,local_88);
        bVar1 = CloseButton(IVar2,&local_94);
        if (bVar1) {
          *p_visible = false;
        }
        memcpy((void *)((long)last_item_backup.DisplayRect.Max + 0x40b0),&button_x,0x3c);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_visible, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_visible && !*p_visible)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader;
    if (p_visible)
        flags |= ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton;
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_visible != NULL)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiLastItemData last_item_backup = g.LastItemData;
        float button_size = g.FontSize;
        float button_x = ImMax(g.LastItemData.Rect.Min.x, g.LastItemData.Rect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = g.LastItemData.Rect.Min.y;
        ImGuiID close_button_id = GetIDWithSeed("#CLOSE", NULL, id);
        if (CloseButton(close_button_id, ImVec2(button_x, button_y)))
            *p_visible = false;
        g.LastItemData = last_item_backup;
    }

    return is_open;
}